

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_Client_deleteMembers(UA_Client *client)

{
  UA_Client_NotificationsAckNumber *pUVar1;
  UA_Client_Subscription *pUVar2;
  UA_Client_NotificationsAckNumber *__ptr;
  UA_Client_Subscription *sub;
  UA_Client *client_00;
  
  UA_Client_disconnect(client);
  UA_SecureChannel_deleteMembersCleanup(&client->channel);
  deleteMembers_noInit(&(client->connection).incompleteMessage,UA_TYPES + 0xe);
  (client->connection).incompleteMessage.length = 0;
  (client->connection).incompleteMessage.data = (UA_Byte *)0x0;
  if ((client->endpointUrl).data != (UA_Byte *)0x0) {
    deleteMembers_noInit(&client->endpointUrl,UA_TYPES + 0xb);
    (client->endpointUrl).length = 0;
    (client->endpointUrl).data = (UA_Byte *)0x0;
  }
  deleteMembers_noInit(&client->token,UA_TYPES + 0x65);
  (client->token).securityPolicyUri.data = (UA_Byte *)0x0;
  (client->token).issuerEndpointUrl.data = (UA_Byte *)0x0;
  (client->token).securityPolicyUri.length = 0;
  (client->token).issuedTokenType.data = (UA_Byte *)0x0;
  (client->token).issuerEndpointUrl.length = 0;
  *(undefined8 *)&(client->token).tokenType = 0;
  (client->token).issuedTokenType.length = 0;
  (client->token).policyId.length = 0;
  (client->token).policyId.data = (UA_Byte *)0x0;
  deleteMembers_noInit(&client->authenticationToken,UA_TYPES + 0x10);
  (client->authenticationToken).identifier.string.data = (UA_Byte *)0x0;
  (client->authenticationToken).namespaceIndex = 0;
  *(undefined2 *)&(client->authenticationToken).field_0x2 = 0;
  (client->authenticationToken).identifierType = UA_NODEIDTYPE_NUMERIC;
  (client->authenticationToken).identifier.string.length = 0;
  if ((client->username).data != (UA_Byte *)0x0) {
    deleteMembers_noInit(&client->username,UA_TYPES + 0xb);
    (client->username).length = 0;
    (client->username).data = (UA_Byte *)0x0;
  }
  if ((client->password).data != (UA_Byte *)0x0) {
    deleteMembers_noInit(&client->password,UA_TYPES + 0xb);
    (client->password).length = 0;
    (client->password).data = (UA_Byte *)0x0;
  }
  __ptr = (client->pendingNotificationsAcks).lh_first;
  while (__ptr != (UA_Client_NotificationsAckNumber *)0x0) {
    pUVar1 = (__ptr->listEntry).le_next;
    if (pUVar1 != (UA_Client_NotificationsAckNumber *)0x0) {
      (pUVar1->listEntry).le_prev = (__ptr->listEntry).le_prev;
    }
    *(__ptr->listEntry).le_prev = pUVar1;
    free(__ptr);
    __ptr = pUVar1;
  }
  client_00 = (UA_Client *)0x0;
  sub = (client->subscriptions).lh_first;
  while (sub != (UA_Client_Subscription *)0x0) {
    pUVar2 = (sub->listEntry).le_next;
    UA_Client_Subscriptions_forceDelete(client_00,sub);
    sub = pUVar2;
  }
  return;
}

Assistant:

static void UA_Client_deleteMembers(UA_Client* client) {
    UA_Client_disconnect(client);
    UA_SecureChannel_deleteMembersCleanup(&client->channel);
    UA_Connection_deleteMembers(&client->connection);
    if(client->endpointUrl.data)
        UA_String_deleteMembers(&client->endpointUrl);
    UA_UserTokenPolicy_deleteMembers(&client->token);
    UA_NodeId_deleteMembers(&client->authenticationToken);
    if(client->username.data)
        UA_String_deleteMembers(&client->username);
    if(client->password.data)
        UA_String_deleteMembers(&client->password);
#ifdef UA_ENABLE_SUBSCRIPTIONS
    UA_Client_NotificationsAckNumber *n, *tmp;
    LIST_FOREACH_SAFE(n, &client->pendingNotificationsAcks, listEntry, tmp) {
        LIST_REMOVE(n, listEntry);
        UA_free(n);
    }
    UA_Client_Subscription *sub, *tmps;
    LIST_FOREACH_SAFE(sub, &client->subscriptions, listEntry, tmps)
        UA_Client_Subscriptions_forceDelete(client, sub); /* force local removal */
#endif
}